

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_ptr_test.cpp
# Opt level: O0

void __thiscall unique_ptr_compare_ptr_Test::TestBody(unique_ptr_compare_ptr_Test *this)

{
  long lVar1;
  bool bVar2;
  Struct2 *pSVar3;
  char *pcVar4;
  Struct2 *pSVar5;
  long in_FS_OFFSET;
  Struct2 *pY;
  Struct2 *pX;
  unique_ptr_compare_ptr_Test *this_local;
  Message local_308;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_19;
  Message local_2e8;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar_18;
  Message local_2c8;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_17;
  Message local_2a8;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_16;
  Message local_288;
  undefined1 local_280 [8];
  AssertionResult gtest_ar_15;
  Message local_268;
  undefined1 local_260 [8];
  AssertionResult gtest_ar_14;
  Message local_248;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_13;
  Message local_228;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_12;
  Message local_208;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_11;
  Message local_1e8;
  int local_1dc;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_10;
  Message local_1c0;
  Struct2 *local_1b8;
  void *local_1b0;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_9;
  Message local_190;
  bool local_181;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_8;
  Message local_168;
  int local_15c;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_7;
  Message local_140;
  int local_134;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_6;
  Message local_118;
  Struct2 *local_110;
  void *local_108;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_5;
  Message local_e8;
  bool local_d9;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_4;
  unique_ptr<Struct2> yPtr;
  Message local_b8;
  int local_ac;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_3;
  Message local_90;
  int local_84;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_2;
  Message local_68;
  Struct2 *local_60;
  void *local_58;
  undefined1 local_50 [8];
  AssertionResult gtest_ar_1;
  Message local_38;
  bool local_29;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  unique_ptr<Struct2> xPtr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar3 = (Struct2 *)operator_new(4);
  Struct2::Struct2(pSVar3,0x7b);
  unique_ptr<Struct2>::unique_ptr((unique_ptr<Struct2> *)&gtest_ar.message_,pSVar3);
  local_29 = true;
  testing::internal::EqHelper<false>::Compare<bool,unique_ptr<Struct2>>
            ((EqHelper<false> *)local_28,"true","xPtr",&local_29,
             (unique_ptr<Struct2> *)&gtest_ar.message_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar2) {
    testing::Message::Message(&local_38);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
               ,0xcb,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  local_58 = (void *)0x0;
  local_60 = unique_ptr<Struct2>::get((unique_ptr<Struct2> *)&gtest_ar.message_);
  testing::internal::CmpHelperNE<void*,Struct2*>
            ((internal *)local_50,"(void*)__null","xPtr.get()",&local_58,&local_60);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar2) {
    testing::Message::Message(&local_68);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
               ,0xcc,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  local_84 = 0x7b;
  pSVar3 = unique_ptr<Struct2>::operator->((unique_ptr<Struct2> *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_80,"123","xPtr->mVal",&local_84,&pSVar3->mVal);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar2) {
    testing::Message::Message(&local_90);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
               ,0xcd,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_ac = 1;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_a8,"1","Struct2::_mNbInstances",&local_ac,
             &Struct2::_mNbInstances);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar2) {
    testing::Message::Message(&local_b8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&yPtr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
               ,0xce,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&yPtr,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&yPtr);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  pSVar3 = unique_ptr<Struct2>::get((unique_ptr<Struct2> *)&gtest_ar.message_);
  pSVar5 = (Struct2 *)operator_new(4);
  Struct2::Struct2(pSVar5,0xea);
  unique_ptr<Struct2>::unique_ptr((unique_ptr<Struct2> *)&gtest_ar_4.message_,pSVar5);
  local_d9 = true;
  testing::internal::EqHelper<false>::Compare<bool,unique_ptr<Struct2>>
            ((EqHelper<false> *)local_d8,"true","xPtr",&local_d9,
             (unique_ptr<Struct2> *)&gtest_ar.message_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar2) {
    testing::Message::Message(&local_e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
               ,0xd4,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  local_108 = (void *)0x0;
  local_110 = unique_ptr<Struct2>::get((unique_ptr<Struct2> *)&gtest_ar.message_);
  testing::internal::CmpHelperNE<void*,Struct2*>
            ((internal *)local_100,"(void*)__null","xPtr.get()",&local_108,&local_110);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar2) {
    testing::Message::Message(&local_118);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
               ,0xd5,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  local_134 = 0x7b;
  pSVar5 = unique_ptr<Struct2>::operator->((unique_ptr<Struct2> *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_130,"123","xPtr->mVal",&local_134,&pSVar5->mVal);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar2) {
    testing::Message::Message(&local_140);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
               ,0xd6,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  local_15c = 2;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_158,"2","Struct2::_mNbInstances",&local_15c,
             &Struct2::_mNbInstances);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar2) {
    testing::Message::Message(&local_168);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
               ,0xd7,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  local_181 = true;
  testing::internal::EqHelper<false>::Compare<bool,unique_ptr<Struct2>>
            ((EqHelper<false> *)local_180,"true","yPtr",&local_181,
             (unique_ptr<Struct2> *)&gtest_ar_4.message_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar2) {
    testing::Message::Message(&local_190);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
               ,0xd9,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  local_1b0 = (void *)0x0;
  local_1b8 = unique_ptr<Struct2>::get((unique_ptr<Struct2> *)&gtest_ar_4.message_);
  testing::internal::CmpHelperNE<void*,Struct2*>
            ((internal *)local_1a8,"(void*)__null","yPtr.get()",&local_1b0,&local_1b8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar2) {
    testing::Message::Message(&local_1c0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
               ,0xda,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  local_1dc = 0xea;
  pSVar5 = unique_ptr<Struct2>::operator->((unique_ptr<Struct2> *)&gtest_ar_4.message_);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_1d8,"234","yPtr->mVal",&local_1dc,&pSVar5->mVal);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar2) {
    testing::Message::Message(&local_1e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
               ,0xdb,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  pSVar5 = unique_ptr<Struct2>::get((unique_ptr<Struct2> *)&gtest_ar_4.message_);
  testing::internal::CmpHelperNE<unique_ptr<Struct2>,unique_ptr<Struct2>>
            ((internal *)local_200,"xPtr","yPtr",(unique_ptr<Struct2> *)&gtest_ar.message_,
             (unique_ptr<Struct2> *)&gtest_ar_4.message_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar2) {
    testing::Message::Message(&local_208);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
               ,0xde,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  if (pSVar3 < pSVar5) {
    testing::internal::CmpHelperLT<unique_ptr<Struct2>,unique_ptr<Struct2>>
              ((internal *)local_220,"xPtr","yPtr",(unique_ptr<Struct2> *)&gtest_ar.message_,
               (unique_ptr<Struct2> *)&gtest_ar_4.message_);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
    if (!bVar2) {
      testing::Message::Message(&local_228);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
                 ,0xe1,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_228);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
      testing::Message::~Message(&local_228);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
    testing::internal::CmpHelperLE<unique_ptr<Struct2>,unique_ptr<Struct2>>
              ((internal *)local_240,"xPtr","yPtr",(unique_ptr<Struct2> *)&gtest_ar.message_,
               (unique_ptr<Struct2> *)&gtest_ar_4.message_);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
    if (!bVar2) {
      testing::Message::Message(&local_248);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
                 ,0xe2,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_248);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
      testing::Message::~Message(&local_248);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
    testing::internal::CmpHelperGT<unique_ptr<Struct2>,unique_ptr<Struct2>>
              ((internal *)local_260,"yPtr","xPtr",(unique_ptr<Struct2> *)&gtest_ar_4.message_,
               (unique_ptr<Struct2> *)&gtest_ar.message_);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
    if (!bVar2) {
      testing::Message::Message(&local_268);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
                 ,0xe3,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_268);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
      testing::Message::~Message(&local_268);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
    testing::internal::CmpHelperGE<unique_ptr<Struct2>,unique_ptr<Struct2>>
              ((internal *)local_280,"yPtr","xPtr",(unique_ptr<Struct2> *)&gtest_ar_4.message_,
               (unique_ptr<Struct2> *)&gtest_ar.message_);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
    if (!bVar2) {
      testing::Message::Message(&local_288);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_280);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
                 ,0xe4,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_288);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
      testing::Message::~Message(&local_288);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
  }
  else {
    testing::internal::CmpHelperGT<unique_ptr<Struct2>,unique_ptr<Struct2>>
              ((internal *)local_2a0,"xPtr","yPtr",(unique_ptr<Struct2> *)&gtest_ar.message_,
               (unique_ptr<Struct2> *)&gtest_ar_4.message_);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
    if (!bVar2) {
      testing::Message::Message(&local_2a8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
                 ,0xe8,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_2a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
      testing::Message::~Message(&local_2a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
    testing::internal::CmpHelperGE<unique_ptr<Struct2>,unique_ptr<Struct2>>
              ((internal *)local_2c0,"xPtr","yPtr",(unique_ptr<Struct2> *)&gtest_ar.message_,
               (unique_ptr<Struct2> *)&gtest_ar_4.message_);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
    if (!bVar2) {
      testing::Message::Message(&local_2c8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
                 ,0xe9,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_2c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
      testing::Message::~Message(&local_2c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
    testing::internal::CmpHelperLT<unique_ptr<Struct2>,unique_ptr<Struct2>>
              ((internal *)local_2e0,"yPtr","xPtr",(unique_ptr<Struct2> *)&gtest_ar_4.message_,
               (unique_ptr<Struct2> *)&gtest_ar.message_);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
    if (!bVar2) {
      testing::Message::Message(&local_2e8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2e0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
                 ,0xea,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_2e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
      testing::Message::~Message(&local_2e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
    testing::internal::CmpHelperLE<unique_ptr<Struct2>,unique_ptr<Struct2>>
              ((internal *)local_300,"yPtr","xPtr",(unique_ptr<Struct2> *)&gtest_ar_4.message_,
               (unique_ptr<Struct2> *)&gtest_ar.message_);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
    if (!bVar2) {
      testing::Message::Message(&local_308);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&this_local,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
                 ,0xeb,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&this_local,&local_308);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&this_local);
      testing::Message::~Message(&local_308);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  }
  unique_ptr<Struct2>::~unique_ptr((unique_ptr<Struct2> *)&gtest_ar_4.message_);
  unique_ptr<Struct2>::~unique_ptr((unique_ptr<Struct2> *)&gtest_ar.message_);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

TEST(unique_ptr, compare_ptr)
{
    // Create a unique_ptr
    unique_ptr<Struct2> xPtr(new Struct2(123));

    EXPECT_EQ(true, xPtr);
    EXPECT_NE((void*)NULL, xPtr.get());
    EXPECT_EQ(123,xPtr->mVal);
    EXPECT_EQ(1, Struct2::_mNbInstances);
    Struct2* pX = xPtr.get();

    // Create another unique_ptr
    unique_ptr<Struct2> yPtr(new Struct2(234));

    EXPECT_EQ(true, xPtr);
    EXPECT_NE((void*)NULL, xPtr.get());
    EXPECT_EQ(123,xPtr->mVal);
    EXPECT_EQ(2, Struct2::_mNbInstances);

    EXPECT_EQ(true, yPtr);
    EXPECT_NE((void*)NULL, yPtr.get());
    EXPECT_EQ(234, yPtr->mVal);
    Struct2* pY = yPtr.get();

    EXPECT_NE(xPtr, yPtr);
    if (pX < pY)
    {
        EXPECT_LT(xPtr, yPtr);
        EXPECT_LE(xPtr, yPtr);
        EXPECT_GT(yPtr, xPtr);
        EXPECT_GE(yPtr, xPtr);
    }
    else // (pX > pY)
    {
        EXPECT_GT(xPtr, yPtr);
        EXPECT_GE(xPtr, yPtr);
        EXPECT_LT(yPtr, xPtr);
        EXPECT_LE(yPtr, xPtr);
    }
}